

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurlHandle.cpp
# Opt level: O2

int __thiscall
curlpp::internal::CurlHandle::executeProgressFunctor
          (CurlHandle *this,double dltotal,double dlnow,double ultotal,double ulnow)

{
  FunctorImpl<int,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::NullType>_>_>_>_>
  *pFVar1;
  int iVar2;
  CallbackException<curlpp::LogicError> *this_00;
  LogicError LStack_28;
  
  pFVar1 = (this->mProgressFunctor).mImpl._M_ptr;
  if (pFVar1 == (FunctorImpl<int,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::NullType>_>_>_>_>
                 *)0x0) {
    this_00 = (CallbackException<curlpp::LogicError> *)operator_new(0x20);
    LogicError::LogicError(&LStack_28,"Null write functor");
    CallbackException<curlpp::LogicError>::CallbackException(this_00,&LStack_28);
    if (this->mException != (CallbackExceptionBase *)0x0) {
      (**(code **)(*(long *)&this->mException->super_RuntimeError + 8))();
    }
    this->mException = (CallbackExceptionBase *)this_00;
    LogicError::~LogicError(&LStack_28);
    iVar2 = 0x2a;
  }
  else {
    iVar2 = (**pFVar1->_vptr_FunctorImpl)();
  }
  return iVar2;
}

Assistant:

int
CurlHandle::executeProgressFunctor(double dltotal, 
																	 double dlnow, 
																	 double ultotal, 
																	 double ulnow)
{
	if (!mProgressFunctor)
	{
		setException(new CallbackException<curlpp::LogicError>(curlpp::LogicError("Null write functor")));
		return CURLE_ABORTED_BY_CALLBACK;
	}

	try
	{
		return mProgressFunctor(dltotal, dlnow, ultotal, ulnow);
	}

	catch(curlpp::CallbackExceptionBase * e)
	{
		setException(e);
	}

	catch(...)
	{
		setException(new CallbackException<curlpp::UnknowException>(curlpp::UnknowException()));
	}

	return CURLE_ABORTED_BY_CALLBACK;
}